

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O1

int main(int argc,char **argv)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- string conversion",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  string_conversion_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- os wrapper",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  os_wrapper_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- fopen",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  fopen_wrapper_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- getenv",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  getenv_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- utf8",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  to_utf8_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- utf16",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  to_utf16_test();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- utf8_to_ascii",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  utf8_to_ascii_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- transcoding",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  transcoding_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- whoami",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  get_whoami_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- file",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  same_file_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- path",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  path_test();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- read from file",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  read_from_file_test();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- hex encode/decode",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  hex_encode_decode_test();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---- rename/delete",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  rename_delete_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- timestamp",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  timestamp_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- is_long_long",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  is_long_long_test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---- memory usage",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  memory_usage_test();
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    try {
        std::cout << "---- string conversion" << std::endl;
        string_conversion_test();
        std::cout << "---- os wrapper" << std::endl;
        os_wrapper_test();
        std::cout << "---- fopen" << std::endl;
        fopen_wrapper_test();
        std::cout << "---- getenv" << std::endl;
        getenv_test();
        std::cout << "---- utf8" << std::endl;
        to_utf8_test();
        std::cout << "---- utf16" << std::endl;
        to_utf16_test();
        std::cout << "---- utf8_to_ascii" << std::endl;
        utf8_to_ascii_test();
        std::cout << "---- transcoding" << std::endl;
        transcoding_test();
        std::cout << "---- whoami" << std::endl;
        get_whoami_test();
        std::cout << "---- file" << std::endl;
        same_file_test();
        std::cout << "---- path" << std::endl;
        path_test();
        std::cout << "---- read from file" << std::endl;
        read_from_file_test();
        std::cout << "---- hex encode/decode" << std::endl;
        hex_encode_decode_test();
        std::cout << "---- rename/delete" << std::endl;
        rename_delete_test();
        std::cout << "---- timestamp" << std::endl;
        timestamp_test();
        std::cout << "---- is_long_long" << std::endl;
        is_long_long_test();
        std::cout << "---- memory usage" << std::endl;
        memory_usage_test();
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
    }

    return 0;
}